

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrint.h
# Opt level: O3

string * __thiscall
cppqc::PrettyPrint<std::vector<int,std::allocator<int>>>::toString_abi_cxx11_
          (string *__return_storage_ptr__,PrettyPrint<std::vector<int,std::allocator<int>>> *this,
          vector<int,_std::allocator<int>_> *x)

{
  ostringstream out;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[",1);
  pretty_print::
  print_container_helper<std::vector<int,_std::allocator<int>_>,_char,_std::char_traits<char>,_pretty_print::delimiters<std::vector<int,_std::allocator<int>_>,_char>_>
  ::printer<std::vector<int,_std::allocator<int>_>_>::print_body
            ((vector<int,_std::allocator<int>_> *)this,(ostream_type *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(const T& x) {
    std::ostringstream out;
    out << x;
    return out.str();
  }